

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

float FastSLog2Slow_C(uint32_t v)

{
  int iVar1;
  uint in_EDI;
  double dVar2;
  uint32_t orig_v;
  float v_f;
  int correction;
  uint32_t y;
  int log_cnt;
  byte local_c;
  float local_4;
  
  if (in_EDI < 0x10000) {
    iVar1 = BitsLog2Floor(in_EDI);
    local_c = (byte)(iVar1 + -7);
    local_4 = (float)in_EDI * (kLog2Table[in_EDI >> (local_c & 0x1f)] + (float)(iVar1 + -7)) +
              (float)((in_EDI & (1 << (local_c & 0x1f)) - 1U) * 0x17 >> 4);
  }
  else {
    dVar2 = log((double)in_EDI);
    local_4 = (float)((double)in_EDI * 1.4426950408889634 * dVar2);
  }
  return local_4;
}

Assistant:

static float FastSLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const int log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    int correction = 0;
    const float v_f = (float)v;
    const uint32_t orig_v = v;
    v >>= log_cnt;
#else
    int log_cnt = 0;
    uint32_t y = 1;
    int correction = 0;
    const float v_f = (float)v;
    const uint32_t orig_v = v;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    // vf = (2^log_cnt) * Xf; where y = 2^log_cnt and Xf < 256
    // Xf = floor(Xf) * (1 + (v % y) / v)
    // log2(Xf) = log2(floor(Xf)) + log2(1 + (v % y) / v)
    // The correction factor: log(1 + d) ~ d; for very small d values, so
    // log2(1 + (v % y) / v) ~ LOG_2_RECIPROCAL * (v % y)/v
    // LOG_2_RECIPROCAL ~ 23/16
    correction = (23 * (orig_v & (y - 1))) >> 4;
    return v_f * (kLog2Table[v] + log_cnt) + correction;
  } else {
    return (float)(LOG_2_RECIPROCAL * v * log((double)v));
  }
}